

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# triangular.hpp
# Opt level: O3

fvar<double,_2UL> * __thiscall
ising::free_energy::triangular::anon_unknown_1::
functor<double,_boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>_>::operator()
          (fvar<double,_2UL> *__return_storage_ptr__,
          functor<double,_boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>_>
          *this,double t1,double t2)

{
  double dVar1;
  ushort uVar2;
  double dVar3;
  double dVar4;
  size_t i;
  long lVar5;
  fvar<double,_2UL> *cr;
  fvar<double,_2UL> retval_4;
  fvar<double,_2UL> retval_2;
  fvar<double,_2UL> retval;
  promote<fvar<double,_2UL>,_fvar<double,_2UL>_> retval_1;
  promote<fvar<double,_2UL>,_fvar<double,_2UL>_> retval_3;
  promote<fvar<double,_2UL>,_fvar<double,_2UL>_> retval_5;
  double local_d8 [4];
  double local_b8 [4];
  double local_98 [4];
  double adStack_78 [6];
  detail local_48 [24];
  fvar<double,_2UL> local_30;
  
  local_98[3] = t1;
  dVar1 = cos(t1);
  local_98[1] = (this->sh2a_).v._M_elems[1];
  local_98[2] = (this->sh2a_).v._M_elems[2];
  local_98[0] = (this->sh2a_).v._M_elems[0] * dVar1;
  if ((local_98[1] != 0.0) || (NAN(local_98[1]))) {
    local_98[1] = dVar1 * local_98[1];
  }
  if (local_98[2] != 0.0) {
    local_98[2] = dVar1 * local_98[2];
  }
  lVar5 = 0;
  do {
    adStack_78[lVar5] = (this->cshabc_).v._M_elems[lVar5] - local_98[lVar5];
    lVar5 = lVar5 + 1;
  } while (lVar5 != 3);
  dVar1 = cos(t2);
  local_b8[1] = (this->sh2b_).v._M_elems[1];
  local_b8[2] = (this->sh2b_).v._M_elems[2];
  local_b8[0] = (this->sh2b_).v._M_elems[0] * dVar1;
  if ((local_b8[1] != 0.0) || (NAN(local_b8[1]))) {
    local_b8[1] = dVar1 * local_b8[1];
  }
  if (local_b8[2] != 0.0) {
    local_b8[2] = dVar1 * local_b8[2];
  }
  lVar5 = 0;
  do {
    adStack_78[lVar5 + 3] = adStack_78[lVar5] - local_b8[lVar5];
    lVar5 = lVar5 + 1;
  } while (lVar5 != 3);
  dVar1 = cos(local_98[3] + t2);
  local_d8[1] = (this->sh2c_).v._M_elems[1];
  local_d8[2] = (this->sh2c_).v._M_elems[2];
  local_d8[0] = (this->sh2c_).v._M_elems[0] * dVar1;
  if ((local_d8[1] != 0.0) || (NAN(local_d8[1]))) {
    local_d8[1] = dVar1 * local_d8[1];
  }
  if (local_d8[2] != 0.0) {
    local_d8[2] = dVar1 * local_d8[2];
  }
  lVar5 = 0;
  do {
    *(double *)(local_48 + lVar5 * 8) = adStack_78[lVar5 + 3] - local_d8[lVar5];
    lVar5 = lVar5 + 1;
  } while (lVar5 != 3);
  boost::math::differentiation::autodiff_v1::detail::log<double,2ul>(&local_30,local_48,cr);
  (__return_storage_ptr__->v)._M_elems[2] = local_30.v._M_elems[2];
  (__return_storage_ptr__->v)._M_elems[0] = local_30.v._M_elems[0];
  (__return_storage_ptr__->v)._M_elems[1] = local_30.v._M_elems[1];
  dVar1 = this->c_;
  (__return_storage_ptr__->v)._M_elems[0] = (__return_storage_ptr__->v)._M_elems[0] * dVar1;
  dVar3 = (__return_storage_ptr__->v)._M_elems[1];
  dVar4 = (__return_storage_ptr__->v)._M_elems[2];
  if ((dVar3 != 0.0) || (NAN(dVar3))) {
    (__return_storage_ptr__->v)._M_elems[1] = dVar1 * dVar3;
  }
  uVar2 = -(ushort)(dVar4 != 0.0);
  if ((uVar2 & 1) != 0) {
    (__return_storage_ptr__->v)._M_elems[2] = dVar1 * dVar4;
  }
  return (fvar<double,_2UL> *)(ulong)uVar2;
}

Assistant:

FVAR operator()(T t1, T t2) const {
    using std::cos;
    using std::log;
    return c_ * log(cshabc_ - sh2a_ * cos(t1) - sh2b_ * cos(t2) -
                    sh2c_ * cos(t1 + t2));
  }